

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

bool __thiscall duckdb::UpdateSegment::HasUncommittedUpdates(UpdateSegment *this,idx_t vector_index)

{
  undefined1 uVar1;
  UpdateInfo *this_00;
  UpdateInfo *info;
  UndoBufferReference pin;
  UndoBufferPointer entry;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> read_lock;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  StorageLockKey *in_stack_ffffffffffffff68;
  UpdateSegment *in_stack_ffffffffffffff70;
  UndoBufferPointer local_30 [2];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar2;
  
  StorageLock::GetSharedLock((StorageLock *)in_stack_ffffffffffffff68);
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
            ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
              *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  local_30[0] = GetUpdateNode(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                              CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  uVar1 = UndoBufferPointer::IsSet(local_30);
  if ((bool)uVar1) {
    UndoBufferPointer::Pin
              ((UndoBufferPointer *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    this_00 = UpdateInfo::Get((UndoBufferReference *)CONCAT17(uVar1,in_stack_ffffffffffffff60));
    bVar2 = UpdateInfo::HasNext(this_00);
    UndoBufferReference::~UndoBufferReference((UndoBufferReference *)0xb8ef77);
  }
  else {
    bVar2 = 0;
  }
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::~unique_ptr
            ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
              *)0xb8ef84);
  return (bool)(bVar2 & 1);
}

Assistant:

bool UpdateSegment::HasUncommittedUpdates(idx_t vector_index) {
	auto read_lock = lock.GetSharedLock();
	auto entry = GetUpdateNode(*read_lock, vector_index);
	if (!entry.IsSet()) {
		return false;
	}
	auto pin = entry.Pin();
	auto &info = UpdateInfo::Get(pin);
	if (info.HasNext()) {
		return true;
	}
	return false;
}